

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_7::Validator::CheckTableVar(Validator *this,Var *var,Table **out_table)

{
  Result RVar1;
  Enum EVar2;
  uint local_1c [2];
  Index index;
  
  RVar1 = CheckVar(this,(Index)((ulong)((long)(this->current_module_->tables).
                                              super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->current_module_->tables).
                                             super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3),var,
                   "table",local_1c);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    EVar2 = Ok;
    if (out_table != (Table **)0x0) {
      *out_table = (this->current_module_->tables).
                   super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                   super__Vector_impl_data._M_start[local_1c[0]];
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result Validator::CheckTableVar(const Var* var, const Table** out_table) {
  Index index;
  CHECK_RESULT(CheckVar(current_module_->tables.size(), var, "table", &index));
  if (out_table) {
    *out_table = current_module_->tables[index];
  }
  return Result::Ok;
}